

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

int SHMRelease(void)

{
  int iVar1;
  
  Volatile<int>::operator--(&lock_count,0);
  CCLock::Leave(&shm_critsec);
  iVar1 = Volatile::operator_cast_to_int((Volatile *)&lock_count);
  return iVar1;
}

Assistant:

int SHMRelease(void)
{
    lock_count--;
    shm_critsec.Leave();

    return lock_count;
}